

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

void * __thiscall CTcPrsMem::alloc(CTcPrsMem *this,size_t siz)

{
  char *pcVar1;
  ulong uVar2;
  size_t sVar3;
  
  if (this->rem_ < siz) {
    alloc_block(this);
    if (this->rem_ < siz) {
      CTcTokenizer::throw_internal_error(0x2afb,siz);
    }
  }
  pcVar1 = this->free_ptr_;
  this->free_ptr_ = (char *)((ulong)(pcVar1 + siz + 7) & 0xfffffffffffffff8);
  uVar2 = (long)((ulong)(pcVar1 + siz + 7) & 0xfffffffffffffff8) - (long)pcVar1;
  sVar3 = 0;
  if (uVar2 <= this->rem_) {
    sVar3 = this->rem_ - uVar2;
  }
  this->rem_ = sVar3;
  return pcVar1;
}

Assistant:

void *CTcPrsMem::alloc(size_t siz)
{
    char *ret;
    size_t space_used;

    /* if there's not enough space available, allocate a new block */
    if (siz > rem_)
    {
        /* allocate a new block */
        alloc_block();

        /* 
         *   if there's still not enough room, the request must exceed the
         *   largest block we can allocate 
         */
        if (siz > rem_)
            G_tok->throw_internal_error(TCERR_PRS_BLK_TOO_BIG, (ulong)siz);
    }

    /* return the free pointer */
    ret = free_ptr_;

    /* advance the free pointer past the space, rounding for alignment */
    free_ptr_ = (char *)osrndpt((unsigned char *)free_ptr_ + siz);

    /* deduct the amount of space we consumed from the available space */
    space_used = free_ptr_ - ret;
    if (space_used > rem_)
        rem_ = 0;
    else
        rem_ -= space_used;

    /* return the allocated space */
    return ret;
}